

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# mqtt_codec.c
# Opt level: O2

BUFFER_HANDLE
mqtt_codec_unsubscribe
          (uint16_t packetId,char **unsubscribeList,size_t count,STRING_HANDLE trace_log)

{
  char *__src;
  int iVar1;
  int iVar2;
  BUFFER_HANDLE ctrlPacket;
  STRING_HANDLE s2;
  size_t sVar3;
  size_t __n;
  uchar *puVar4;
  size_t index;
  ulong uVar5;
  
  if ((count == 0 || unsubscribeList == (char **)0x0) ||
     (ctrlPacket = BUFFER_new(), ctrlPacket == (BUFFER_HANDLE)0x0)) {
    return (BUFFER_HANDLE)0x0;
  }
  iVar1 = constructSubscibeTypeVariableHeader(ctrlPacket,packetId);
  if (iVar1 != 0) {
    BUFFER_delete(ctrlPacket);
    return (BUFFER_HANDLE)0x0;
  }
  if (trace_log == (STRING_HANDLE)0x0) {
    s2 = (STRING_HANDLE)0x0;
  }
  else {
    s2 = STRING_construct_sprintf(" | PACKET_ID: %u",(ulong)packetId);
  }
  uVar5 = 0;
  iVar1 = 0;
  while ((uVar5 < count && (iVar1 == 0))) {
    sVar3 = BUFFER_length(ctrlPacket);
    __n = strlen(unsubscribeList[uVar5]);
    iVar1 = 0x8f;
    if (__n < 0x10000) {
      iVar2 = BUFFER_enlarge(ctrlPacket,__n + 2);
      iVar1 = 0x93;
      if (iVar2 == 0) {
        puVar4 = BUFFER_u_char(ctrlPacket);
        __src = unsubscribeList[uVar5];
        *(ushort *)(puVar4 + sVar3) = (ushort)__n << 8 | (ushort)__n >> 8;
        memcpy(puVar4 + sVar3 + 2,__src,__n);
        iVar1 = 0;
      }
    }
    if (s2 != (STRING_HANDLE)0x0) {
      STRING_sprintf(s2," | TOPIC_NAME: %s",unsubscribeList[uVar5]);
    }
    uVar5 = uVar5 + 1;
  }
  if (iVar1 == 0) {
    if (trace_log != (STRING_HANDLE)0x0) {
      STRING_copy(trace_log,"UNSUBSCRIBE");
    }
    iVar1 = constructFixedHeader(ctrlPacket,UNSUBSCRIBE_TYPE,'\x02');
    if (iVar1 == 0) {
      if (trace_log != (STRING_HANDLE)0x0) {
        STRING_concat_with_STRING(trace_log,s2);
      }
      goto LAB_0011457b;
    }
  }
  BUFFER_delete(ctrlPacket);
  ctrlPacket = (BUFFER_HANDLE)0x0;
LAB_0011457b:
  if (s2 != (STRING_HANDLE)0x0) {
    STRING_delete(s2);
    return ctrlPacket;
  }
  return ctrlPacket;
}

Assistant:

BUFFER_HANDLE mqtt_codec_unsubscribe(uint16_t packetId, const char** unsubscribeList, size_t count, STRING_HANDLE trace_log)
{
    BUFFER_HANDLE result;
    /* Codes_SRS_MQTT_CODEC_07_027: [If the parameters unsubscribeList is NULL or if count is 0 then mqtt_codec_unsubscribe shall return NULL.] */
    if (unsubscribeList == NULL || count == 0)
    {
        result = NULL;
    }
    else
    {
        /* Codes_SRS_MQTT_CODEC_07_030: [mqtt_codec_unsubscribe shall return a BUFFER_HANDLE that represents a MQTT SUBSCRIBE message.] */
        result = BUFFER_new();
        if (result != NULL)
        {
            if (constructSubscibeTypeVariableHeader(result, packetId) != 0)
            {
                /* Codes_SRS_MQTT_CODEC_07_029: [If any error is encountered then mqtt_codec_unsubscribe shall return NULL.] */
                BUFFER_delete(result);
                result = NULL;
            }
            else
            {
                STRING_HANDLE unsub_trace = NULL;
                if (trace_log != NULL)
                {
                    unsub_trace = STRING_construct_sprintf(" | PACKET_ID: %"PRIu16, packetId);
                }
                /* Codes_SRS_MQTT_CODEC_07_028: [mqtt_codec_unsubscribe shall iterate through count items in the unsubscribeList.] */
                if (addListItemsToUnsubscribePacket(result, unsubscribeList, count, unsub_trace) != 0)
                {
                    /* Codes_SRS_MQTT_CODEC_07_029: [If any error is encountered then mqtt_codec_unsubscribe shall return NULL.] */
                    BUFFER_delete(result);
                    result = NULL;
                }
                else
                {
                    if (trace_log != NULL)
                    {
                        (void)STRING_copy(trace_log, "UNSUBSCRIBE");
                    }
                    if (constructFixedHeader(result, UNSUBSCRIBE_TYPE, UNSUBSCRIBE_FIXED_HEADER_FLAG) != 0)
                    {
                        /* Codes_SRS_MQTT_CODEC_07_029: [If any error is encountered then mqtt_codec_unsubscribe shall return NULL.] */
                        BUFFER_delete(result);
                        result = NULL;
                    }
                    else
                    {
                        if (trace_log != NULL)
                        {
                            (void)STRING_concat_with_STRING(trace_log, unsub_trace);
                        }
                    }
                }
                if (unsub_trace != NULL)
                {
                    STRING_delete(unsub_trace);
                }
            }
        }
    }
    return result;
}